

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O2

void __thiscall
GenericCommandWrapperIRCCommand::trigger
          (GenericCommandWrapperIRCCommand *this,IRC_Bot *source,string_view in_channel,
          string_view in_nick,string_view in_parameters)

{
  string *psVar1;
  string *this_00;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  
  this_00 = (string *)
            (**(code **)(*(long *)this->m_command + 0x18))
                      (this->m_command,in_parameters._M_len,in_parameters._M_str);
  do {
    if (this_00 == (string *)0x0) {
      return;
    }
    switch(*(undefined4 *)(this_00 + 0x20)) {
    case 0:
    case 2:
      uVar5 = *(undefined8 *)this_00;
      uVar2 = *(undefined8 *)(this_00 + 8);
      pcVar3 = in_channel._M_str;
      sVar4 = in_channel._M_len;
      break;
    case 1:
    case 3:
      Jupiter::IRC::Client::sendNotice
                (source,in_nick._M_len,in_nick._M_str,*(undefined8 *)(this_00 + 8),
                 *(undefined8 *)this_00);
      goto LAB_001105a9;
    default:
      uVar5 = *(undefined8 *)this_00;
      uVar2 = *(undefined8 *)(this_00 + 8);
      pcVar3 = in_nick._M_str;
      sVar4 = in_nick._M_len;
    }
    Jupiter::IRC::Client::sendMessage(source,sVar4,pcVar3,uVar2,uVar5);
LAB_001105a9:
    psVar1 = *(string **)(this_00 + 0x28);
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00,0x30);
    this_00 = psVar1;
  } while( true );
}

Assistant:

void GenericCommandWrapperIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view in_nick, std::string_view in_parameters) {
	Jupiter::GenericCommand::ResponseLine *del;
	Jupiter::GenericCommand::ResponseLine *result = m_command->trigger(in_parameters);

	while (result != nullptr)
	{
		switch (result->type)
		{
		case Jupiter::GenericCommand::DisplayType::PublicSuccess:
		case Jupiter::GenericCommand::DisplayType::PublicError:
			source->sendMessage(in_channel, result->response);
			break;
		case Jupiter::GenericCommand::DisplayType::PrivateSuccess:
		case Jupiter::GenericCommand::DisplayType::PrivateError:
			source->sendNotice(in_nick, result->response);
			break;
		default:
			source->sendMessage(in_nick, result->response);
			break;
		}

		del = result;
		result = result->next;
		delete del;
	}
}